

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O3

void * __thiscall
entt::basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::get
          (basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *this,entity_type entt)

{
  pointer ppeVar1;
  entity *peVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  ulong uVar5;
  entity_type __c;
  undefined4 in_register_00000034;
  
  uVar5 = (ulong)((entt & 0xfffff) >> 0xc);
  ppeVar1 = (this->sparse).super__Vector_base<entt::entity_*,_std::allocator<entt::entity_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (((uVar5 < (ulong)((long)(this->sparse).
                              super__Vector_base<entt::entity_*,_std::allocator<entt::entity_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3)) &&
      (peVar2 = ppeVar1[uVar5], peVar2 != (entity *)0x0)) &&
     (__c = entt & 0xfff00000 ^ peVar2[entt & 0xfff], __c < 0xfffff)) {
    pcVar4 = index(this,(char *)CONCAT44(in_register_00000034,entt),__c);
    iVar3 = (**this->_vptr_basic_sparse_set)(this,pcVar4);
    return (void *)CONCAT44(extraout_var,iVar3);
  }
  __assert_fail("contains(entt)",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x3487,
                "const void *entt::basic_sparse_set<entt::entity>::get(const entity_type) const [Entity = entt::entity]"
               );
}

Assistant:

const void *get(const entity_type entt) const ENTT_NOEXCEPT {
        ENTT_ASSERT(contains(entt), "Set does not contain entity");
        return get_at(index(entt));
    }